

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O2

void Map_MappingCuts(Map_Man_t *p)

{
  char cVar1;
  char cVar2;
  Map_Man_t *pMVar3;
  undefined8 p1;
  Map_Man_t *pMVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ProgressBar *p_00;
  Map_CutTable_t *p_01;
  Map_Cut_t **ppMVar9;
  int *piVar10;
  Map_Node_t *pMVar11;
  Map_Cut_t *pMVar12;
  Map_Cut_t *pMVar13;
  Map_Cut_t *pMVar14;
  abctime aVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  Map_Cut_t *pMVar20;
  Map_Man_t *pMVar21;
  Map_Man_t *pMVar22;
  Map_Cut_t *pMVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  Map_Cut_t **local_138;
  Map_Cut_t **local_120;
  uint local_114;
  long local_100;
  undefined1 local_d0 [104];
  Map_Node_t *ppNodes [6];
  
  local_d0._8_8_ = Abc_Clock();
  if (4 < p->nVarsMax - 2U) {
    __assert_fail("p->nVarsMax > 1 && p->nVarsMax < 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperCut.c"
                  ,0xb4,"void Map_MappingCuts(Map_Man_t *)");
  }
  for (lVar25 = 0; lVar25 < p->nInputs; lVar25 = lVar25 + 1) {
    Map_MappingCutsInput(p,p->pInputs[lVar25]);
  }
  uVar30 = p->vMapObjs->nSize;
  p_00 = Extra_ProgressBarStart(_stdout,uVar30);
  p_01 = (Map_CutTable_t *)calloc(1,0x38);
  uVar17 = 9999;
  do {
    do {
      uVar16 = (int)uVar17 + 1;
      uVar18 = (ulong)uVar16;
      uVar31 = uVar17 & 1;
      uVar17 = uVar18;
    } while (uVar31 != 0);
    uVar31 = 3;
    do {
      iVar5 = (int)uVar31;
      if (uVar16 < (uint)(iVar5 * iVar5)) {
        p_01->nBins = uVar16;
        ppMVar9 = (Map_Cut_t **)calloc(1,(long)(int)uVar16 << 3);
        p_01->pBins = ppMVar9;
        piVar10 = (int *)malloc(8000);
        p_01->pCuts = piVar10;
        ppMVar9 = (Map_Cut_t **)malloc(16000);
        p_01->pArray = ppMVar9;
        ppMVar9 = (Map_Cut_t **)malloc(16000);
        p_01->pCuts1 = ppMVar9;
        ppMVar9 = (Map_Cut_t **)malloc(16000);
        p_01->pCuts2 = ppMVar9;
        if ((int)uVar30 < 1) {
          uVar30 = 0;
        }
        uVar31 = (ulong)uVar30;
        uVar17 = 0;
        local_d0._16_8_ = p_00;
        local_d0._24_8_ = uVar31;
        goto LAB_0030c735;
      }
      uVar28 = uVar18 % uVar31;
      uVar31 = (ulong)(iVar5 + 2);
    } while ((int)uVar28 != 0);
  } while( true );
LAB_0030c735:
  if (uVar17 == uVar31) {
    Extra_ProgressBarStop(p_00);
    free(p_01->pCuts1);
    free(p_01->pCuts2);
    free(p_01->pArray);
    free(p_01->pBins);
    free(p_01->pCuts);
    free(p_01);
    if (p->fVerbose == 0) {
      return;
    }
    uVar30 = Map_MappingCountAllCuts(p);
    iVar5 = 0x71661e;
    printf("Nodes = %6d.  Total %d-feasible cuts = %10d.  Per node = %.1f. ",
           SUB84((double)((float)(int)uVar30 / (float)p->nNodes),0),(ulong)(uint)p->nNodes,
           (ulong)(uint)p->nVarsMax,(ulong)uVar30);
    Abc_Print(iVar5,"%s =","Time");
    aVar15 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(aVar15 - local_d0._8_8_) / 1000000.0,0));
    return;
  }
  pMVar11 = p->vMapObjs->pArray[uVar17];
  iVar5 = Map_NodeIsBuf(pMVar11);
  if (iVar5 == 0) {
    iVar5 = Map_NodeIsAnd(pMVar11);
    if (iVar5 != 0) {
      if (pMVar11->pCuts == (Map_Cut_t *)0x0) {
        pMVar20 = *(Map_Cut_t **)(((ulong)pMVar11->p2 & 0xfffffffffffffffe) + 0xa0);
        uVar30 = (uint)pMVar11->p1 & 1;
        uVar24 = (uint)pMVar11->p2 & 1;
        local_d0._72_8_ = (float *)0x0;
        local_d0._80_8_ = (char **)0x0;
        local_d0._88_8_ = (Map_Time_t *)0x0;
        local_d0._56_8_ = (Map_NodeVec_t *)0x0;
        local_d0._64_8_ = (Map_NodeVec_t *)0x0;
        local_d0._40_4_ = 0;
        local_d0._44_4_ = 0;
        local_d0._48_8_ = (Map_Node_t *)0x0;
        local_120 = p_01->pCuts1;
        ppMVar9 = p_01->pCuts2;
        uVar6 = Map_CutList2Array(local_120,
                                  *(Map_Cut_t **)(((ulong)pMVar11->p1 & 0xfffffffffffffffe) + 0xa0))
        ;
        uVar7 = Map_CutList2Array(ppMVar9,pMVar20);
        uVar16 = uVar6;
        uVar27 = uVar24;
        local_138 = ppMVar9;
        local_114 = uVar7;
        if ((int)uVar7 < (int)uVar6) {
          uVar16 = uVar7;
          uVar27 = uVar30;
          uVar30 = uVar24;
          local_138 = local_120;
          local_120 = ppMVar9;
          local_114 = uVar6;
        }
        uVar28 = (ulong)uVar30;
        pMVar20 = (Map_Cut_t *)&pMVar11->pCuts;
        local_d0._32_8_ = pMVar11;
        Map_CutTableRestart(p_01);
        uVar31 = (ulong)uVar27;
        uVar29 = 0;
        uVar18 = 0;
        if (0 < (int)uVar16) {
          uVar18 = (ulong)uVar16;
        }
        local_100 = 1;
        iVar5 = 0;
        for (; uVar29 != uVar18; uVar29 = uVar29 + 1) {
          for (lVar25 = 0; local_100 != lVar25; lVar25 = lVar25 + 1) {
            pMVar12 = local_120[uVar29];
            pMVar13 = local_138[lVar25];
            if (((p->nVarsMax != (int)pMVar12->nLeaves) || (pMVar12->nLeaves != pMVar13->nLeaves))
               || ((pMVar12->ppLeaves[0] == pMVar13->ppLeaves[0] &&
                   (pMVar12->ppLeaves[1] == pMVar13->ppLeaves[1])))) {
              iVar8 = Map_CutMergeTwo(pMVar12,pMVar13,ppNodes,p->nVarsMax);
              if ((iVar8 != 0) &&
                 (pMVar11 = (Map_Node_t *)Map_CutTableConsider(p,p_01,ppNodes,iVar8),
                 pMVar11 != (Map_Node_t *)0x0)) {
                pMVar11->pNext = (Map_Node_t *)((ulong)pMVar12 ^ uVar28);
                *(Map_Cut_t **)&pMVar11->Num = (Map_Cut_t *)((ulong)pMVar13 ^ uVar31);
                lVar19 = (long)*(char *)((long)&pMVar11->p2 + 4);
                pMVar11->p = (Map_Man_t *)ppNodes[lVar19 + -8];
                ppNodes[lVar19 + -8] = pMVar11;
                iVar5 = iVar5 + 1;
                if (iVar5 == 1000) goto LAB_0030cb4e;
              }
            }
          }
          for (uVar26 = 0; uVar29 != uVar26; uVar26 = uVar26 + 1) {
            pMVar12 = local_120[uVar26];
            pMVar13 = local_138[uVar29];
            if (((p->nVarsMax != (int)pMVar12->nLeaves) || (pMVar12->nLeaves != pMVar13->nLeaves))
               || ((pMVar12->ppLeaves[0] == pMVar13->ppLeaves[0] &&
                   (pMVar12->ppLeaves[1] == pMVar13->ppLeaves[1])))) {
              iVar8 = Map_CutMergeTwo(pMVar12,pMVar13,ppNodes,p->nVarsMax);
              if ((iVar8 != 0) &&
                 (pMVar11 = (Map_Node_t *)Map_CutTableConsider(p,p_01,ppNodes,iVar8),
                 pMVar11 != (Map_Node_t *)0x0)) {
                pMVar11->pNext = (Map_Node_t *)((ulong)pMVar12 ^ uVar28);
                *(Map_Cut_t **)&pMVar11->Num = (Map_Cut_t *)((ulong)pMVar13 ^ uVar31);
                lVar25 = (long)*(char *)((long)&pMVar11->p2 + 4);
                pMVar11->p = (Map_Man_t *)ppNodes[lVar25 + -8];
                ppNodes[lVar25 + -8] = pMVar11;
                iVar5 = iVar5 + 1;
                if (iVar5 == 1000) goto LAB_0030cb4e;
              }
            }
          }
          local_100 = local_100 + 1;
        }
        if ((int)uVar7 < (int)uVar6) {
          uVar6 = uVar7;
        }
        for (lVar25 = (long)(int)uVar6; (uVar6 - uVar16) + local_114 != (int)lVar25;
            lVar25 = lVar25 + 1) {
          for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
            pMVar12 = local_120[uVar29];
            pMVar13 = local_138[lVar25];
            if (((p->nVarsMax != (int)pMVar12->nLeaves) || (pMVar12->nLeaves != pMVar13->nLeaves))
               || ((pMVar12->ppLeaves[0] == pMVar13->ppLeaves[0] &&
                   (pMVar12->ppLeaves[1] == pMVar13->ppLeaves[1])))) {
              iVar8 = Map_CutMergeTwo(pMVar12,pMVar13,ppNodes,p->nVarsMax);
              if ((iVar8 != 0) &&
                 (pMVar11 = (Map_Node_t *)Map_CutTableConsider(p,p_01,ppNodes,iVar8),
                 pMVar11 != (Map_Node_t *)0x0)) {
                pMVar11->pNext = (Map_Node_t *)((ulong)pMVar12 ^ uVar28);
                *(Map_Cut_t **)&pMVar11->Num = (Map_Cut_t *)((ulong)pMVar13 ^ uVar31);
                lVar19 = (long)*(char *)((long)&pMVar11->p2 + 4);
                pMVar11->p = (Map_Man_t *)ppNodes[lVar19 + -8];
                ppNodes[lVar19 + -8] = pMVar11;
                iVar5 = iVar5 + 1;
                if (iVar5 == 1000) goto LAB_0030cb4e;
              }
            }
          }
        }
LAB_0030cb4e:
        p1 = local_d0._32_8_;
        local_d0._0_8_ = (Map_Cut_t *)0x0;
        iVar5 = p->nVarsMax;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        pMVar21 = (Map_Man_t *)local_d0;
        for (uVar31 = 1; uVar31 != iVar5 + 1; uVar31 = uVar31 + 1) {
          pMVar3 = (Map_Man_t *)ppNodes[uVar31 - 8];
          pMVar22 = pMVar21;
          pMVar4 = pMVar3;
          if (pMVar3 != (Map_Man_t *)0x0) {
            do {
              pMVar22 = pMVar4;
              pMVar4 = (Map_Man_t *)pMVar22->pBins;
            } while ((Map_Man_t *)pMVar22->pBins != (Map_Man_t *)0x0);
            pMVar21->pBins = (Map_Node_t **)pMVar3;
          }
          pMVar21 = pMVar22;
        }
        pMVar21->pBins = (Map_Node_t **)0x0;
        pMVar12 = Map_CutSortCuts(p,p_01,(Map_Cut_t *)local_d0._0_8_);
        if (pMVar12 == (Map_Cut_t *)0x0) {
          __assert_fail("pList",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperCut.c"
                        ,0xf2,
                        "Map_Cut_t *Map_CutCompute(Map_Man_t *, Map_CutTable_t *, Map_Node_t *)");
        }
        pMVar11 = (Map_Node_t *)p1;
        if (*(Map_Node_t **)(p1 + 0x58) == (Map_Node_t *)0x0) {
          while (pMVar11 = pMVar11->pNextE, pMVar11 != (Map_Node_t *)0x0) {
            pMVar13 = pMVar11->pCuts;
            pMVar14 = pMVar12;
            pMVar23 = pMVar12;
            if (pMVar13 == (Map_Cut_t *)0x0) {
              __assert_fail("pTemp->pCuts",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperCut.c"
                            ,0xf8,
                            "Map_Cut_t *Map_CutCompute(Map_Man_t *, Map_CutTable_t *, Map_Node_t *)"
                           );
            }
            for (; pMVar23 != (Map_Cut_t *)0x0; pMVar23 = pMVar23->pNext) {
              pMVar14 = pMVar23;
            }
            if (pMVar14->pNext != (Map_Cut_t *)0x0) {
              __assert_fail("pRoot->pNext == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mapper/mapperCut.c"
                            ,0x2ba,"Map_Cut_t *Map_CutUnionLists(Map_Cut_t *, Map_Cut_t *)");
            }
            pMVar14->pNext = pMVar13->pNext;
            pMVar13->pNext = (Map_Cut_t *)0x0;
            pMVar12 = Map_CutSortCuts(p,p_01,pMVar12);
          }
        }
        pMVar13 = Map_CutAlloc(p);
        pMVar13->nLeaves = '\x01';
        pMVar13->ppLeaves[0] = (Map_Node_t *)p1;
        pMVar13->uTruth = 0xaaaaaaaa;
        pMVar13->pNext = pMVar12;
        *(Map_Cut_t **)(p1 + 0xa0) = pMVar13;
        if (pMVar12 == (Map_Cut_t *)0x0) {
          pMVar14 = (Map_Cut_t *)0x0;
          pMVar23 = pMVar13;
          goto LAB_0030cc61;
        }
        do {
          pMVar14 = pMVar12->pNext;
          pMVar23 = pMVar13;
LAB_0030cc61:
          do {
            pMVar13 = pMVar12;
            pMVar12 = pMVar14;
            uVar31 = local_d0._24_8_;
            p_00 = (ProgressBar *)local_d0._16_8_;
            if (pMVar13 == (Map_Cut_t *)0x0) {
              if ((*(Map_Node_t **)(p1 + 0x58) != (Map_Node_t *)0x0) &&
                 (iVar5 = Map_NodeComparePhase((Map_Node_t *)p1,*(Map_Node_t **)(p1 + 0x58)),
                 iVar5 != 0)) {
                while (pMVar20 = pMVar20->pNext, pMVar20 != (Map_Cut_t *)0x0) {
                  pMVar20->Phase = '\x01';
                }
              }
              goto LAB_0030c765;
            }
            pMVar14 = *(Map_Cut_t **)pMVar20;
            do {
              pMVar14 = pMVar14->pNext;
              if (pMVar14 == pMVar13) goto LAB_0030cce4;
              cVar1 = pMVar14->nLeaves;
              uVar31 = 0;
              if ('\0' < cVar1) {
                uVar31 = (ulong)(uint)(int)cVar1;
              }
              for (uVar18 = 0; uVar18 != uVar31; uVar18 = uVar18 + 1) {
                cVar2 = pMVar13->nLeaves;
                uVar28 = 0;
                if ('\0' < cVar2) {
                  uVar28 = (ulong)(uint)(int)cVar2;
                }
                for (uVar29 = 0; uVar28 != uVar29; uVar29 = uVar29 + 1) {
                  if (pMVar14->ppLeaves[uVar18] == pMVar13->ppLeaves[uVar29]) {
                    uVar28 = uVar29 & 0xffffffff;
                    break;
                  }
                }
                if ((uint)uVar28 == (int)cVar2) {
                  uVar31 = uVar18 & 0xffffffff;
                  break;
                }
              }
            } while ((uint)uVar31 != (int)cVar1);
            pMVar23->pNext = pMVar13->pNext;
            Map_CutFree(p,pMVar13);
            pMVar13 = pMVar23;
LAB_0030cce4:
            pMVar14 = (Map_Cut_t *)0x0;
            pMVar23 = pMVar13;
          } while (pMVar12 == (Map_Cut_t *)0x0);
        } while( true );
      }
      goto LAB_0030c765;
    }
  }
  else {
    Map_MappingCutsInput(p,pMVar11);
LAB_0030c765:
    if ((p_00 == (ProgressBar *)0x0) || ((long)p_00->nItemsNext <= (long)uVar17)) {
      Extra_ProgressBarUpdate_int(p_00,(int)uVar17,"Cuts ...");
    }
  }
  uVar17 = uVar17 + 1;
  goto LAB_0030c735;
}

Assistant:

void Map_MappingCuts( Map_Man_t * p )
{
    ProgressBar * pProgress;
    Map_CutTable_t * pTable;
    Map_Node_t * pNode;
    int nCuts, nNodes, i;
    abctime clk = Abc_Clock();
    // set the elementary cuts for the PI variables
    assert( p->nVarsMax > 1 && p->nVarsMax < 7 );
    for ( i = 0; i < p->nInputs; i++ )
        Map_MappingCutsInput( p, p->pInputs[i] );

    // compute the cuts for the internal nodes
    nNodes = p->vMapObjs->nSize;
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    pTable = Map_CutTableStart( p );
    for ( i = 0; i < nNodes; i++ )
    {
        pNode = p->vMapObjs->pArray[i];
        if ( Map_NodeIsBuf(pNode) )
            Map_MappingCutsInput( p, pNode );
        else if ( Map_NodeIsAnd(pNode) )
            Map_CutCompute( p, pTable, pNode );
        else continue;
        Extra_ProgressBarUpdate( pProgress, i, "Cuts ..." );
    }
    Extra_ProgressBarStop( pProgress );
    Map_CutTableStop( pTable );

    // report the stats
    if ( p->fVerbose )
    {
        nCuts = Map_MappingCountAllCuts(p);
        printf( "Nodes = %6d.  Total %d-feasible cuts = %10d.  Per node = %.1f. ", 
               p->nNodes, p->nVarsMax, nCuts, ((float)nCuts)/p->nNodes );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // print the cuts for the first primary output
//    Map_CutListPrint( p, Map_Regular(p->pOutputs[0]) );
}